

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allintra_vis.c
# Opt level: O0

int64_t get_satd(AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col)

{
  uint uVar1;
  int local_58;
  int col;
  int row;
  int64_t satd;
  int mb_count;
  int mb_stride;
  int mi_step;
  int mi_high;
  int mi_wide;
  AV1_COMMON *cm;
  int mi_col_local;
  int mi_row_local;
  BLOCK_SIZE bsize_local;
  AV1_COMP *cpi_local;
  
  uVar1 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                [cpi->weber_bsize];
  mb_count = 0;
  satd = 0;
  for (row = mi_row; col = mi_col,
      row < (int)(mi_row + (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                                 [bsize]); row = uVar1 + row) {
    for (; col < (int)(mi_col + (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                                      [bsize]); col = uVar1 + col) {
      if ((row < (cpi->common).mi_params.mi_rows) && (col < (cpi->common).mi_params.mi_cols)) {
        satd = cpi->mb_weber_stats
               [(row / (int)uVar1) * (cpi->frame_info).mi_cols + col / (int)uVar1].satd + satd;
        mb_count = mb_count + 1;
      }
    }
  }
  if (mb_count != 0) {
    satd = (int64_t)(int)(satd / (long)mb_count);
  }
  if (satd < 1) {
    local_58 = 1;
  }
  else {
    local_58 = (int)satd;
  }
  return (long)local_58;
}

Assistant:

static int64_t get_satd(AV1_COMP *const cpi, BLOCK_SIZE bsize, int mi_row,
                        int mi_col) {
  AV1_COMMON *const cm = &cpi->common;
  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];

  const int mi_step = mi_size_wide[cpi->weber_bsize];
  int mb_stride = cpi->frame_info.mi_cols;
  int mb_count = 0;
  int64_t satd = 0;

  for (int row = mi_row; row < mi_row + mi_high; row += mi_step) {
    for (int col = mi_col; col < mi_col + mi_wide; col += mi_step) {
      if (row >= cm->mi_params.mi_rows || col >= cm->mi_params.mi_cols)
        continue;

      satd += cpi->mb_weber_stats[(row / mi_step) * mb_stride + (col / mi_step)]
                  .satd;
      ++mb_count;
    }
  }

  if (mb_count) satd = (int)(satd / mb_count);
  satd = AOMMAX(1, satd);

  return (int)satd;
}